

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicUsageVS::Setup(BasicUsageVS *this)

{
  BasicUsageVS *this_local;
  
  this->counter_buffer_[1] = 0;
  this->counter_buffer_[0] = 0;
  this->xfb_buffer_[1] = 0;
  this->xfb_buffer_[0] = 0;
  this->array_buffer_ = 0;
  this->vao_ = 0;
  this->prog_ = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		counter_buffer_[0] = counter_buffer_[1] = 0;
		xfb_buffer_[0] = xfb_buffer_[1] = 0;
		array_buffer_					= 0;
		vao_							= 0;
		prog_							= 0;
		return NO_ERROR;
	}